

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
                   idx_t idx)

{
  Vector *pVVar1;
  ulong uVar2;
  Vector *pVVar3;
  string_t *extraout_RDX;
  idx_t len;
  undefined1 *__dest;
  char *pcVar4;
  long lVar5;
  Vector *input_size;
  anon_union_16_2_67f50693_for_value aVar6;
  string_t data;
  string sep;
  uint local_98;
  undefined4 local_94;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined1 local_88 [16];
  undefined4 local_78 [4];
  string local_68;
  undefined8 local_48;
  long local_40;
  undefined8 local_38;
  char *local_30;
  
  local_40 = right.value._8_8_;
  local_48 = right.value._0_8_;
  local_30 = left.value._8_8_;
  pcVar4 = local_30;
  if (left.value._0_4_ < 0xd) {
    pcVar4 = (char *)((long)&local_38 + 4);
  }
  lVar5 = (long)&local_48 + 4;
  if (0xc < right.value._0_4_) {
    lVar5 = local_40;
  }
  local_88._8_8_ = local_88._0_8_;
  local_38 = left.value._0_8_;
  local_88._0_8_ = local_78;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,lVar5,(ulong)right.value._0_4_ + lVar5);
  local_98 = (uint)local_88._8_8_;
  if (local_98 < 0xd) {
    local_8c = 0;
    local_94 = 0;
    uStack_90 = 0;
    if (local_98 != 0) {
      switchD_00b041bd::default(&local_94,(void *)local_88._0_8_,(ulong)(local_98 & 0xf));
      local_88._8_8_ = extraout_RDX;
    }
  }
  else {
    local_94 = *(undefined4 *)local_88._0_8_;
    uStack_90 = (undefined4)local_88._0_8_;
    local_8c = SUB84(local_88._0_8_,4);
  }
  GetSeparator_abi_cxx11_(&local_68,(duckdb *)&local_98,(string_t *)local_88._8_8_);
  input_size = (Vector *)(left.value._0_8_ & 0xffffffff);
  if ((undefined4 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_);
  }
  pVVar1 = (Vector *)FindLast(pcVar4,(idx_t)input_size,&local_68);
  pVVar3 = (Vector *)&DAT_00000001;
  if (left.value._0_4_ != 1) {
    pVVar3 = pVVar1;
  }
  if (pVVar1 != (Vector *)0x0) {
    pVVar3 = pVVar1;
  }
  pVVar1 = (Vector *)0x0;
  if (pVVar3 <= input_size) {
    pVVar1 = pVVar3;
  }
  local_88 = (undefined1  [16])StringVector::EmptyString((StringVector *)fun.result,pVVar1,len);
  __dest = local_88._8_8_;
  if (local_88._0_4_ < 0xd) {
    __dest = local_88 + 4;
  }
  switchD_00b041bd::default(__dest,pcVar4,(size_t)pVVar1);
  uVar2 = (ulong)(uint)local_88._0_4_;
  if (uVar2 < 0xd) {
    switchD_00569a20::default(local_88 + 4 + uVar2,0,0xc - uVar2);
    pcVar4 = (char *)local_88._8_8_;
  }
  else {
    local_88._4_4_ = *(undefined4 *)local_88._8_8_;
    pcVar4 = (char *)local_88._8_8_;
  }
  data.value.pointer.ptr = (char *)pVVar3;
  data.value._0_8_ = pcVar4;
  aVar6.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddString((StringVector *)fun.result,(Vector *)local_88._0_8_,data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar6.pointer;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}